

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O1

void __thiscall soul::Value::~Value(Value *this)

{
  uchar *puVar1;
  
  (this->allocatedData).allocatedData.numActive = 0;
  if (8 < (this->allocatedData).allocatedData.numAllocated) {
    puVar1 = (this->allocatedData).allocatedData.items;
    if (puVar1 != (uchar *)0x0) {
      operator_delete__(puVar1);
    }
    (this->allocatedData).allocatedData.items = (uchar *)(this->allocatedData).allocatedData.space;
    (this->allocatedData).allocatedData.numAllocated = 8;
  }
  RefCountedPtr<soul::Structure>::decIfNotNull((this->type).structure.object);
  return;
}

Assistant:

Value::~Value() = default;